

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProtoHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  int iVar1;
  string *psVar2;
  FileDescriptor *this_00;
  string local_a0;
  undefined1 local_80 [8];
  string dependency;
  char *extension;
  FileDescriptor *dep;
  int i;
  undefined1 local_40 [8];
  string filename_identifier;
  string *info_path_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  if (((this->options_).proto_h & 1U) != 0) {
    filename_identifier.field_2._8_8_ = info_path;
    psVar2 = FileDescriptor::name_abi_cxx11_(this->file_);
    FilenameIdentifier((string *)local_40,psVar2);
    GenerateTopHeaderGuard(this,printer,(string *)local_40);
    GenerateLibraryIncludes(this,printer);
    for (dep._0_4_ = 0; iVar1 = FileDescriptor::public_dependency_count(this->file_),
        (int)dep < iVar1; dep._0_4_ = (int)dep + 1) {
      this_00 = FileDescriptor::public_dependency(this->file_,(int)dep);
      dependency.field_2._8_8_ = anon_var_dwarf_2e32d;
      psVar2 = FileDescriptor::name_abi_cxx11_(this_00);
      StripProto(&local_a0,psVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_a0,(char *)dependency.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_a0);
      io::Printer::Print(printer,"#include \"$dependency$\"  // IWYU pragma: export\n","dependency",
                         (string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
    }
    GenerateMetadataPragma(this,printer,(string *)filename_identifier.field_2._8_8_);
    GenerateHeader(this,printer);
    GenerateBottomHeaderGuard(this,printer,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void FileGenerator::GenerateProtoHeader(io::Printer* printer,
                                        const string& info_path) {
  if (!options_.proto_h) {
    return;
  }

  string filename_identifier = FilenameIdentifier(file_->name());
  GenerateTopHeaderGuard(printer, filename_identifier);


  GenerateLibraryIncludes(printer);

  for (int i = 0; i < file_->public_dependency_count(); i++) {
    const FileDescriptor* dep = file_->public_dependency(i);
    const char* extension = ".proto.h";
    string dependency = StripProto(dep->name()) + extension;
    printer->Print(
      "#include \"$dependency$\"  // IWYU pragma: export\n",
      "dependency", dependency);
  }

  GenerateMetadataPragma(printer, info_path);

  GenerateHeader(printer);

  GenerateBottomHeaderGuard(printer, filename_identifier);
}